

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_columnref.cpp
# Opt level: O3

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::Transformer::TransformStarExpression(Transformer *this,PGAStar *star)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *__s;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var3;
  undefined8 uVar4;
  bool bVar5;
  __hashtable *__h;
  size_t sVar6;
  pointer pSVar7;
  iterator iVar8;
  iterator iVar9;
  iterator iVar10;
  type a;
  BaseExpression *this_00;
  StarExpression *pSVar11;
  pointer pPVar12;
  type expr;
  ParserException *pPVar13;
  size_type in_RDX;
  undefined8 *puVar14;
  optional_ptr<duckdb_libpgquery::PGList,_true> exclude_column_list;
  optional_ptr<duckdb_libpgquery::PGList,_true> list_1;
  string replace_entry;
  QualifiedColumnName exclude_column;
  optional_ptr<duckdb_libpgquery::PGValue,_true> value;
  _Head_base<0UL,_duckdb::StarExpression_*,_false> local_280;
  optional_ptr<duckdb_libpgquery::PGList,_true> local_278;
  __node_base_ptr local_270;
  undefined1 local_268 [24];
  size_type local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_228;
  undefined1 local_220 [16];
  undefined4 uStack_210;
  undefined4 uStack_20c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_208;
  __node_base local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  key_type local_1e8;
  undefined1 local_1c8 [16];
  ParsedExpression local_1b8;
  _Hash_node_base *local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  _Alloc_hider local_168;
  __node_base local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  StarExpression *local_148;
  __node_base_ptr local_140;
  uint local_138;
  undefined4 uStack_134;
  ExpressionType EStack_130;
  ExpressionClass EStack_12f;
  undefined2 uStack_12e;
  undefined4 uStack_12c;
  _Alloc_hider local_128;
  optional_ptr<duckdb_libpgquery::PGNode,_true> local_120;
  undefined1 local_118 [24];
  char local_100 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  undefined1 local_e0 [16];
  undefined1 local_d0 [32];
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  __s = *(char **)(in_RDX + 8);
  local_250 = in_RDX;
  local_248._M_allocated_capacity = (size_type)&local_238;
  local_120.ptr = (PGNode *)star;
  local_118._0_8_ = this;
  if (__s == (char *)0x0) {
    local_248._8_8_ = 0;
    local_238._M_allocated_capacity = local_238._M_allocated_capacity & 0xffffffffffffff00;
  }
  else {
    sVar6 = strlen(__s);
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,__s,__s + sVar6);
  }
  local_280._M_head_impl = (StarExpression *)operator_new(0x110);
  local_1c8._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)(local_1c8 + 0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_allocated_capacity != &local_238) {
    local_1c8._0_8_ = local_248._M_allocated_capacity;
  }
  local_1b8.super_BaseExpression._vptr_BaseExpression =
       (_func_int **)local_238._M_allocated_capacity;
  local_1c8._8_8_ = local_248._8_8_;
  local_248._8_8_ = 0;
  local_238._M_allocated_capacity = local_238._M_allocated_capacity & 0xffffffffffffff00;
  local_248._M_allocated_capacity = (size_type)&local_238;
  StarExpression::StarExpression(local_280._M_head_impl,(string *)local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_1c8 + 0x10)) {
    operator_delete((void *)local_1c8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_allocated_capacity != &local_238) {
    operator_delete((void *)local_248._M_allocated_capacity);
  }
  if ((*(long *)(local_250 + 0x18) != 0) &&
     (puVar14 = *(undefined8 **)(*(long *)(local_250 + 0x18) + 8), puVar14 != (undefined8 *)0x0)) {
    do {
      local_278.ptr = (PGList *)*puVar14;
      optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid(&local_278);
      TransformQualifiedColumnName((QualifiedColumnName *)local_1c8,local_278.ptr);
      pSVar7 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
               ::operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                             *)&local_280);
      iVar8 = ::std::
              _Hashtable<duckdb::QualifiedColumnName,_duckdb::QualifiedColumnName,_std::allocator<duckdb::QualifiedColumnName>,_std::__detail::_Identity,_duckdb::QualifiedColumnEquality,_duckdb::QualifiedColumnHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(&(pSVar7->exclude_list)._M_h,(QualifiedColumnName *)local_1c8);
      unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>::
      operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                  *)&local_280);
      if (iVar8.super__Node_iterator_base<duckdb::QualifiedColumnName,_true>._M_cur !=
          (__node_type *)0x0) {
        pPVar13 = (ParserException *)__cxa_allocate_exception(0x10);
        local_248._M_allocated_capacity = (size_type)&local_238;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_248,"Duplicate entry \"%s\" in EXCLUDE list","");
        QualifiedColumnName::ToString_abi_cxx11_(&local_50,(QualifiedColumnName *)local_1c8);
        ParserException::ParserException<std::__cxx11::string>
                  (pPVar13,(string *)&local_248,&local_50);
        __cxa_throw(pPVar13,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pSVar7 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
               ::operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                             *)&local_280);
      local_248._M_allocated_capacity = (size_type)&pSVar7->exclude_list;
      ::std::
      _Hashtable<duckdb::QualifiedColumnName,duckdb::QualifiedColumnName,std::allocator<duckdb::QualifiedColumnName>,std::__detail::_Identity,duckdb::QualifiedColumnEquality,duckdb::QualifiedColumnHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<duckdb::QualifiedColumnName,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::QualifiedColumnName,true>>>>
                ((_Hashtable<duckdb::QualifiedColumnName,duckdb::QualifiedColumnName,std::allocator<duckdb::QualifiedColumnName>,std::__detail::_Identity,duckdb::QualifiedColumnEquality,duckdb::QualifiedColumnHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)local_248._M_allocated_capacity,(QualifiedColumnName *)local_1c8,&local_248);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_p != &local_158) {
        operator_delete(local_168._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8.super_BaseExpression.query_location.index != &local_178) {
        operator_delete((void *)local_1b8.super_BaseExpression.query_location.index);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8.super_BaseExpression.alias._M_dataplus._M_p !=
          &local_1b8.super_BaseExpression.alias.field_2) {
        operator_delete(local_1b8.super_BaseExpression.alias._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_1c8 + 0x10)) {
        operator_delete((void *)local_1c8._0_8_);
      }
      puVar14 = (undefined8 *)puVar14[1];
    } while (puVar14 != (undefined8 *)0x0);
  }
  if ((*(long *)(local_250 + 0x20) != 0) &&
     (puVar14 = *(undefined8 **)(*(long *)(local_250 + 0x20) + 8), puVar14 != (undefined8 *)0x0)) {
    do {
      local_278.ptr = (PGList *)*puVar14;
      optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid(&local_278);
      TransformExpression((Transformer *)(local_268 + 0x10),local_120);
      optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid(&local_278);
      local_128._M_p = *(((string *)&(local_278.ptr)->tail)->_M_dataplus)._M_p;
      optional_ptr<duckdb_libpgquery::PGValue,_true>::CheckValid
                ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)&local_128);
      ::std::__cxx11::string::string
                ((string *)local_248._M_local_buf,(char *)*(PGListCell **)(local_128._M_p + 8),
                 (allocator *)local_1c8);
      pSVar7 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
               ::operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                             *)&local_280);
      iVar9 = ::std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(pSVar7->replace_list)._M_h,(key_type *)&local_248);
      unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>::
      operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                  *)&local_280);
      if (iVar9.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_true>
          ._M_cur != (__node_type *)0x0) {
        pPVar13 = (ParserException *)__cxa_allocate_exception(0x10);
        local_1c8._0_8_ = local_1c8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1c8,"Duplicate entry \"%s\" in REPLACE list","");
        local_d0._0_8_ = local_d0 + 0x10;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_d0,local_248._M_allocated_capacity,
                   (undefined1 *)(local_248._8_8_ + local_248._M_allocated_capacity));
        ParserException::ParserException<std::__cxx11::string>
                  (pPVar13,(string *)local_1c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
        __cxa_throw(pPVar13,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pSVar7 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
               ::operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                             *)&local_280);
      local_118._8_8_ = local_100;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)(local_118 + 8),local_248._M_allocated_capacity,
                 (undefined1 *)(local_248._8_8_ + local_248._M_allocated_capacity));
      QualifiedColumnName::QualifiedColumnName
                ((QualifiedColumnName *)local_1c8,(string *)(local_118 + 8));
      iVar8 = ::std::
              _Hashtable<duckdb::QualifiedColumnName,_duckdb::QualifiedColumnName,_std::allocator<duckdb::QualifiedColumnName>,_std::__detail::_Identity,_duckdb::QualifiedColumnEquality,_duckdb::QualifiedColumnHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(&(pSVar7->exclude_list)._M_h,(QualifiedColumnName *)local_1c8);
      unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>::
      operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                  *)&local_280);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_p != &local_158) {
        operator_delete(local_168._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8.super_BaseExpression.query_location.index != &local_178) {
        operator_delete((void *)local_1b8.super_BaseExpression.query_location.index);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8.super_BaseExpression.alias._M_dataplus._M_p !=
          &local_1b8.super_BaseExpression.alias.field_2) {
        operator_delete(local_1b8.super_BaseExpression.alias._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_1c8 + 0x10)) {
        operator_delete((void *)local_1c8._0_8_);
      }
      if ((char *)local_118._8_8_ != local_100) {
        operator_delete((void *)local_118._8_8_);
      }
      if (iVar8.super__Node_iterator_base<duckdb::QualifiedColumnName,_true>._M_cur !=
          (__node_type *)0x0) {
        pPVar13 = (ParserException *)__cxa_allocate_exception(0x10);
        local_1c8._0_8_ = local_1c8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1c8,"Column \"%s\" cannot occur in both EXCLUDE and REPLACE list"
                   ,"");
        local_f0._M_allocated_capacity = (size_type)local_e0;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f0,local_248._M_allocated_capacity,
                   (undefined1 *)(local_248._8_8_ + local_248._M_allocated_capacity));
        ParserException::ParserException<std::__cxx11::string>
                  (pPVar13,(string *)local_1c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f0);
        __cxa_throw(pPVar13,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pSVar7 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
               ::operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                             *)&local_280);
      local_1c8._0_8_ = local_1c8 + 0x10;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_allocated_capacity != &local_238) {
        local_1c8._0_8_ = local_248._M_allocated_capacity;
      }
      local_1b8.super_BaseExpression._vptr_BaseExpression =
           (_func_int **)local_238._M_allocated_capacity;
      local_1c8._8_8_ = local_248._8_8_;
      local_248._8_8_ = 0;
      local_238._M_allocated_capacity = local_238._M_allocated_capacity & 0xffffffffffffff00;
      local_1b8.super_BaseExpression.alias._M_dataplus._M_p = (pointer)local_268._16_8_;
      local_268._16_8_ = (long *)0x0;
      local_248._M_allocated_capacity = (size_type)&local_238;
      ::std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_emplace<std::pair<std::__cxx11::string,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&pSVar7->replace_list,(QualifiedColumnName *)local_1c8);
      if ((long *)local_1b8.super_BaseExpression.alias._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_1b8.super_BaseExpression.alias._M_dataplus._M_p + 8))();
      }
      local_1b8.super_BaseExpression.alias._M_dataplus._M_p = (pointer)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_1c8 + 0x10)) {
        operator_delete((void *)local_1c8._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_allocated_capacity != &local_238) {
        operator_delete((void *)local_248._M_allocated_capacity);
      }
      if ((long *)local_268._16_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_268._16_8_ + 8))();
      }
      puVar14 = (undefined8 *)puVar14[1];
    } while (puVar14 != (undefined8 *)0x0);
  }
  if ((*(long *)(local_250 + 0x28) != 0) &&
     (puVar14 = *(undefined8 **)(*(long *)(local_250 + 0x28) + 8), puVar14 != (undefined8 *)0x0)) {
    paVar2 = &local_1b8.super_BaseExpression.alias.field_2;
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_220 + 8);
    do {
      local_268._16_8_ = *puVar14;
      optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid
                ((optional_ptr<duckdb_libpgquery::PGList,_true> *)(local_268 + 0x10));
      local_128._M_p = (pointer)**(undefined8 **)(local_268._16_8_ + 8);
      optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid
                ((optional_ptr<duckdb_libpgquery::PGList,_true> *)&local_128);
      TransformQualifiedColumnName((QualifiedColumnName *)&local_248,(PGList *)local_128._M_p);
      optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid
                ((optional_ptr<duckdb_libpgquery::PGList,_true> *)(local_268 + 0x10));
      ::std::__cxx11::string::string
                ((string *)&local_278,(char *)**(undefined8 **)(local_268._16_8_ + 0x10),
                 (allocator *)local_1c8);
      pSVar7 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
               ::operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                             *)&local_280);
      iVar10 = ::std::
               _Hashtable<duckdb::QualifiedColumnName,_std::pair<const_duckdb::QualifiedColumnName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_duckdb::QualifiedColumnName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_duckdb::QualifiedColumnEquality,_duckdb::QualifiedColumnHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find(&(pSVar7->rename_list)._M_h,(key_type *)&local_248);
      unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>::
      operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                  *)&local_280);
      if (iVar10.
          super__Node_iterator_base<std::pair<const_duckdb::QualifiedColumnName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
          ._M_cur != (__node_type *)0x0) {
        pPVar13 = (ParserException *)__cxa_allocate_exception(0x10);
        local_1c8._0_8_ = local_1c8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1c8,"Duplicate entry \"%s\" in EXCLUDE list","");
        QualifiedColumnName::ToString_abi_cxx11_(&local_70,(QualifiedColumnName *)&local_248);
        ParserException::ParserException<std::__cxx11::string>
                  (pPVar13,(string *)local_1c8,&local_70);
        __cxa_throw(pPVar13,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pSVar7 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
               ::operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                             *)&local_280);
      iVar8 = ::std::
              _Hashtable<duckdb::QualifiedColumnName,_duckdb::QualifiedColumnName,_std::allocator<duckdb::QualifiedColumnName>,_std::__detail::_Identity,_duckdb::QualifiedColumnEquality,_duckdb::QualifiedColumnHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(&(pSVar7->exclude_list)._M_h,(key_type *)&local_248);
      unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>::
      operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                  *)&local_280);
      if (iVar8.super__Node_iterator_base<duckdb::QualifiedColumnName,_true>._M_cur !=
          (__node_type *)0x0) {
        pPVar13 = (ParserException *)__cxa_allocate_exception(0x10);
        local_1c8._0_8_ = local_1c8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1c8,"Column \"%s\" cannot occur in both EXCLUDE and RENAME list",
                   "");
        QualifiedColumnName::ToString_abi_cxx11_(&local_90,(QualifiedColumnName *)&local_248);
        ParserException::ParserException<std::__cxx11::string>
                  (pPVar13,(string *)local_1c8,&local_90);
        __cxa_throw(pPVar13,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pSVar7 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
               ::operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                             *)&local_280);
      iVar9 = ::std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(pSVar7->replace_list)._M_h,&local_1e8);
      unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>::
      operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                  *)&local_280);
      if (iVar9.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_true>
          ._M_cur != (__node_type *)0x0) {
        pPVar13 = (ParserException *)__cxa_allocate_exception(0x10);
        local_1c8._0_8_ = local_1c8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1c8,"Column \"%s\" cannot occur in both REPLACE and RENAME list",
                   "");
        QualifiedColumnName::ToString_abi_cxx11_(&local_b0,(QualifiedColumnName *)&local_248);
        ParserException::ParserException<std::__cxx11::string>
                  (pPVar13,(string *)local_1c8,&local_b0);
        __cxa_throw(pPVar13,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pSVar7 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
               ::operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                             *)&local_280);
      local_1c8._0_8_ = local_1c8 + 0x10;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_allocated_capacity != &local_238) {
        local_1c8._0_8_ = local_248._M_allocated_capacity;
      }
      local_1b8.super_BaseExpression._vptr_BaseExpression =
           (_func_int **)local_238._M_allocated_capacity;
      local_1c8._8_8_ = local_248._8_8_;
      local_248._8_8_ = 0;
      local_238._M_allocated_capacity = local_238._M_allocated_capacity & 0xffffffffffffff00;
      if (local_228 == paVar1) {
        local_1b8.super_BaseExpression.alias.field_2._8_4_ = uStack_210;
        local_1b8.super_BaseExpression.alias.field_2._12_4_ = uStack_20c;
        local_1b8.super_BaseExpression.alias._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_1b8.super_BaseExpression.alias._M_dataplus._M_p = (pointer)local_228;
      }
      local_1b8.super_BaseExpression.alias.field_2._M_allocated_capacity._4_4_ = local_220._12_4_;
      local_1b8.super_BaseExpression.alias.field_2._M_allocated_capacity._0_4_ = local_220._8_4_;
      local_1b8.super_BaseExpression.alias._M_string_length = local_220._0_8_;
      local_220._0_8_ = 0;
      local_220._8_4_ = local_220._8_4_ & 0xffffff00;
      local_1b8.super_BaseExpression.query_location.index = (idx_t)&local_178;
      if (local_208 == &local_1f8) {
        local_178._8_4_ = local_1f8._8_4_;
        local_178._12_4_ = local_1f8._12_4_;
      }
      else {
        local_1b8.super_BaseExpression.query_location.index = (idx_t)local_208;
      }
      local_178._M_allocated_capacity._4_4_ = local_1f8._M_allocated_capacity._4_4_;
      local_178._M_allocated_capacity._0_4_ = local_1f8._M_allocated_capacity._0_4_;
      local_180 = local_200._M_nxt;
      local_200._M_nxt = (_Hash_node_base *)0x0;
      local_1f8._M_allocated_capacity._0_4_ = local_1f8._M_allocated_capacity._0_4_ & 0xffffff00;
      local_168._M_p = (pointer)&local_158;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p == &local_1e8.field_2) {
        local_158._8_4_ = local_1e8.field_2._8_4_;
        local_158._12_4_ = local_1e8.field_2._12_4_;
      }
      else {
        local_168._M_p = local_1e8._M_dataplus._M_p;
      }
      local_158._M_allocated_capacity._4_4_ = local_1e8.field_2._M_allocated_capacity._4_4_;
      local_158._M_allocated_capacity._0_4_ = local_1e8.field_2._M_allocated_capacity._0_4_;
      local_160._M_nxt = (_Hash_node_base *)local_1e8._M_string_length;
      local_1e8._M_string_length = 0;
      local_1e8.field_2._M_allocated_capacity._0_4_ =
           local_1e8.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      if ((StarExpression *)local_278.ptr == (StarExpression *)local_268) {
        EStack_130 = local_268[8];
        EStack_12f = local_268[9];
        uStack_12e = local_268._10_2_;
        uStack_12c = local_268._12_4_;
        local_148 = (StarExpression *)&local_138;
      }
      else {
        local_148 = (StarExpression *)local_278.ptr;
      }
      _local_138 = (pointer)CONCAT44(local_268._4_4_,local_268._0_4_);
      local_140 = local_270;
      local_270 = (__node_base_ptr)0x0;
      local_268._0_4_ = local_268._0_4_ & 0xffffff00;
      local_278.ptr = (PGList *)local_268;
      local_248._M_allocated_capacity = (size_type)&local_238;
      local_228 = paVar1;
      local_208 = &local_1f8;
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      ::std::
      _Hashtable<duckdb::QualifiedColumnName,std::pair<duckdb::QualifiedColumnName_const,std::__cxx11::string>,std::allocator<std::pair<duckdb::QualifiedColumnName_const,std::__cxx11::string>>,std::__detail::_Select1st,duckdb::QualifiedColumnEquality,duckdb::QualifiedColumnHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<duckdb::QualifiedColumnName,std::__cxx11::string>>
                ((_Hashtable<duckdb::QualifiedColumnName,std::pair<duckdb::QualifiedColumnName_const,std::__cxx11::string>,std::allocator<std::pair<duckdb::QualifiedColumnName_const,std::__cxx11::string>>,std::__detail::_Select1st,duckdb::QualifiedColumnEquality,duckdb::QualifiedColumnHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&pSVar7->rename_list,local_1c8);
      if (local_148 != (StarExpression *)&local_138) {
        operator_delete(local_148);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_p != &local_158) {
        operator_delete(local_168._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8.super_BaseExpression.query_location.index != &local_178) {
        operator_delete((void *)local_1b8.super_BaseExpression.query_location.index);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8.super_BaseExpression.alias._M_dataplus._M_p != paVar2) {
        operator_delete(local_1b8.super_BaseExpression.alias._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_1c8 + 0x10)) {
        operator_delete((void *)local_1c8._0_8_);
      }
      if ((StarExpression *)local_278.ptr != (StarExpression *)local_268) {
        operator_delete(local_278.ptr);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p);
      }
      if (local_208 != &local_1f8) {
        operator_delete(local_208);
      }
      if (local_228 != paVar1) {
        operator_delete(local_228);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_allocated_capacity != &local_238) {
        operator_delete((void *)local_248._M_allocated_capacity);
      }
      puVar14 = (undefined8 *)puVar14[1];
    } while (puVar14 != (undefined8 *)0x0);
  }
  if (*(long *)(local_250 + 0x10) != 0) {
    TransformExpression((Transformer *)local_1c8,local_120);
    pSVar7 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>::
             operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                         *)&local_280);
    uVar4 = local_1c8._0_8_;
    local_1c8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    _Var3._M_head_impl =
         (pSVar7->expr).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pSVar7->expr).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (ParsedExpression *)uVar4;
    if ((_Var3._M_head_impl != (ParsedExpression *)0x0) &&
       ((**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))(),
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_1c8._0_8_ !=
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0)) {
      (**(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._0_8_)->_M_allocated_capacity + 8))();
    }
    pSVar7 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>::
             operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                         *)&local_280);
    a = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
        operator*(&pSVar7->expr);
    bVar5 = StarExpression::IsStar(a);
    if (bVar5) {
      pSVar7 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
               ::operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                             *)&local_280);
      this_00 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->(&pSVar7->expr)->super_BaseExpression;
      pSVar11 = BaseExpression::Cast<duckdb::StarExpression>(this_00);
      pSVar7 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
               ::operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                             *)&local_280);
      ::std::__cxx11::string::_M_assign((string *)&pSVar7->relation_name);
      pSVar7 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
               ::operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                             *)&local_280);
      ::std::
      _Hashtable<duckdb::QualifiedColumnName,_duckdb::QualifiedColumnName,_std::allocator<duckdb::QualifiedColumnName>,_std::__detail::_Identity,_duckdb::QualifiedColumnEquality,_duckdb::QualifiedColumnHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::_M_move_assign(&(pSVar7->exclude_list)._M_h,&pSVar11->exclude_list);
      pSVar7 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
               ::operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                             *)&local_280);
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_move_assign(&(pSVar7->replace_list)._M_h,&pSVar11->replace_list);
      pSVar7 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
               ::operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                             *)&local_280);
      ::std::
      _Hashtable<duckdb::QualifiedColumnName,_std::pair<const_duckdb::QualifiedColumnName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_duckdb::QualifiedColumnName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_duckdb::QualifiedColumnEquality,_duckdb::QualifiedColumnHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_move_assign(&(pSVar7->rename_list)._M_h,&pSVar11->rename_list);
      pSVar7 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
               ::operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                             *)&local_280);
      _Var3._M_head_impl =
           (pSVar7->expr).
           super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
      (pSVar7->expr).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
           (ParsedExpression *)0x0;
      if (_Var3._M_head_impl != (ParsedExpression *)0x0) {
        (**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))();
      }
    }
    else {
      pSVar7 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
               ::operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                             *)&local_280);
      pPVar12 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator->(&pSVar7->expr);
      if ((pPVar12->super_BaseExpression).type == LAMBDA) {
        local_248._M_allocated_capacity = 0;
        local_248._8_8_ = 0;
        local_238._M_allocated_capacity = 0;
        pSVar11 = (StarExpression *)operator_new(0x110);
        local_1c8._8_8_ = (ParserOptions *)0x0;
        local_1b8.super_BaseExpression._vptr_BaseExpression =
             (_func_int **)
             ((ulong)local_1b8.super_BaseExpression._vptr_BaseExpression & 0xffffffffffffff00);
        local_1c8._0_8_ = (ParsedExpression *)(local_1c8 + 0x10);
        StarExpression::StarExpression(pSVar11,(string *)local_1c8);
        if ((ParsedExpression *)local_1c8._0_8_ != (ParsedExpression *)(local_1c8 + 0x10)) {
          operator_delete((void *)local_1c8._0_8_);
        }
        local_278.ptr = (PGList *)pSVar11;
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)local_248._M_local_buf,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&local_278);
        if ((StarExpression *)local_278.ptr != (StarExpression *)0x0) {
          (**(code **)(*(long *)local_278.ptr + 8))();
        }
        pSVar7 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                 ::operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                               *)&local_280);
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)local_248._M_local_buf,&pSVar7->expr);
        make_uniq<duckdb::FunctionExpression,char_const(&)[12],duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
                  ((duckdb *)local_1c8,(char (*) [12])"list_filter",
                   (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                    *)&local_248);
        uVar4 = local_1c8._0_8_;
        local_1c8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        pSVar7 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                 ::operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                               *)&local_280);
        _Var3._M_head_impl =
             (pSVar7->expr).
             super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             ._M_t.
             super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
             .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
        (pSVar7->expr).
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
             (ParsedExpression *)uVar4;
        if (_Var3._M_head_impl != (ParsedExpression *)0x0) {
          (**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))();
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1c8._0_8_)->_M_allocated_capacity + 8))();
        }
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   *)&local_248);
      }
    }
  }
  bVar5 = *(bool *)(local_250 + 0x30);
  pSVar7 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>::
           operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                       *)&local_280);
  pSVar7->columns = bVar5;
  expr = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>::
         operator*((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                    *)&local_280);
  SetQueryLocation(&expr->super_ParsedExpression,*(int *)(local_250 + 0x34));
  *(StarExpression **)local_118._0_8_ = local_280._M_head_impl;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          )local_118._0_8_;
}

Assistant:

unique_ptr<ParsedExpression> Transformer::TransformStarExpression(duckdb_libpgquery::PGAStar &star) {
	auto result = make_uniq<StarExpression>(star.relation ? star.relation : string());
	if (star.except_list) {
		for (auto head = star.except_list->head; head; head = head->next) {
			auto exclude_column_list = PGPointerCast<duckdb_libpgquery::PGList>(head->data.ptr_value);
			auto exclude_column = TransformQualifiedColumnName(*exclude_column_list);
			// qualified - add to exclude list
			if (result->exclude_list.find(exclude_column) != result->exclude_list.end()) {
				throw ParserException("Duplicate entry \"%s\" in EXCLUDE list", exclude_column.ToString());
			}
			result->exclude_list.insert(std::move(exclude_column));
		}
	}
	if (star.replace_list) {
		for (auto head = star.replace_list->head; head; head = head->next) {
			auto list = PGPointerCast<duckdb_libpgquery::PGList>(head->data.ptr_value);
			D_ASSERT(list->length == 2);
			auto replace_expression =
			    TransformExpression(PGPointerCast<duckdb_libpgquery::PGNode>(list->head->data.ptr_value));
			auto value = PGPointerCast<duckdb_libpgquery::PGValue>(list->tail->data.ptr_value);
			D_ASSERT(value->type == duckdb_libpgquery::T_PGString);
			string replace_entry = value->val.str;
			if (result->replace_list.find(replace_entry) != result->replace_list.end()) {
				throw ParserException("Duplicate entry \"%s\" in REPLACE list", replace_entry);
			}
			if (result->exclude_list.find(QualifiedColumnName(replace_entry)) != result->exclude_list.end()) {
				throw ParserException("Column \"%s\" cannot occur in both EXCLUDE and REPLACE list", replace_entry);
			}
			result->replace_list.insert(make_pair(std::move(replace_entry), std::move(replace_expression)));
		}
	}
	if (star.rename_list) {
		for (auto head = star.rename_list->head; head; head = head->next) {
			auto list = PGPointerCast<duckdb_libpgquery::PGList>(head->data.ptr_value);
			D_ASSERT(list->length == 2);
			auto rename_column_list = PGPointerCast<duckdb_libpgquery::PGList>(list->head->data.ptr_value);
			auto rename_column = TransformQualifiedColumnName(*rename_column_list);
			string new_name = char_ptr_cast(list->tail->data.ptr_value);
			if (result->rename_list.find(rename_column) != result->rename_list.end()) {
				throw ParserException("Duplicate entry \"%s\" in EXCLUDE list", rename_column.ToString());
			}
			if (result->exclude_list.find(rename_column) != result->exclude_list.end()) {
				throw ParserException("Column \"%s\" cannot occur in both EXCLUDE and RENAME list",
				                      rename_column.ToString());
			}
			if (result->replace_list.find(rename_column.column) != result->replace_list.end()) {
				throw ParserException("Column \"%s\" cannot occur in both REPLACE and RENAME list",
				                      rename_column.ToString());
			}
			result->rename_list.insert(make_pair(std::move(rename_column), std::move(new_name)));
		}
	}
	if (star.expr) {
		D_ASSERT(star.columns);
		D_ASSERT(result->relation_name.empty());
		D_ASSERT(result->exclude_list.empty());
		D_ASSERT(result->replace_list.empty());
		result->expr = TransformExpression(star.expr);
		if (StarExpression::IsStar(*result->expr)) {
			auto &child_star = result->expr->Cast<StarExpression>();
			result->relation_name = child_star.relation_name;
			result->exclude_list = std::move(child_star.exclude_list);
			result->replace_list = std::move(child_star.replace_list);
			result->rename_list = std::move(child_star.rename_list);
			result->expr.reset();
		} else if (result->expr->GetExpressionType() == ExpressionType::LAMBDA) {
			vector<unique_ptr<ParsedExpression>> children;
			children.push_back(make_uniq<StarExpression>());
			children.push_back(std::move(result->expr));
			auto list_filter = make_uniq<FunctionExpression>("list_filter", std::move(children));
			result->expr = std::move(list_filter);
		}
	}
	result->columns = star.columns;
	SetQueryLocation(*result, star.location);
	return std::move(result);
}